

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O0

void __thiscall
ByteData256_ByteDataConstructor_Test::~ByteData256_ByteDataConstructor_Test
          (ByteData256_ByteDataConstructor_Test *this)

{
  ByteData256_ByteDataConstructor_Test *this_local;
  
  ~ByteData256_ByteDataConstructor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData256, ByteDataConstructor) {
  ByteData data("1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data = ByteData256(data);

  EXPECT_STREQ(byte_data.GetHex().c_str(), data.GetHex().c_str());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "201234567890123456789012345678901234567890123456789012345678901234");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
}